

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t read_mac_metadata_blob
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  char cVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  wchar_t *pwVar4;
  char *pcVar5;
  char *pcVar6;
  size_t min;
  void *p;
  wchar_t *pwVar7;
  char *pcVar8;
  ulong request;
  
  pwVar3 = archive_entry_pathname_w(entry);
  pwVar7 = pwVar3;
  if (pwVar3 == (wchar_t *)0x0) {
    pcVar5 = archive_entry_pathname(entry);
    pcVar8 = pcVar5;
    if (pcVar5 == (char *)0x0) {
      return L'\xffffffe7';
    }
    do {
      while( true ) {
        pcVar6 = pcVar5 + 1;
        cVar1 = *pcVar5;
        pcVar5 = pcVar6;
        if (cVar1 != '/') break;
        if (*pcVar6 != '\0') {
          pcVar8 = pcVar6;
        }
      }
    } while (cVar1 != '\0');
    if (*pcVar8 != '.') {
      return L'\0';
    }
    if (pcVar8[1] != '_') {
      return L'\0';
    }
    if (pcVar8[2] == '\0') {
      return L'\0';
    }
  }
  else {
    do {
      while( true ) {
        pwVar4 = pwVar3 + 1;
        wVar2 = *pwVar3;
        pwVar3 = pwVar4;
        if (wVar2 != L'/') break;
        if (*pwVar4 != L'\0') {
          pwVar7 = pwVar4;
        }
      }
    } while (wVar2 != L'\0');
    if (*pwVar7 != L'.') {
      return L'\0';
    }
    if (pwVar7[1] != L'_') {
      return L'\0';
    }
    if (pwVar7[2] == L'\0') {
      return L'\0';
    }
  }
  min = archive_entry_size(entry);
  if ((-1 < (long)min) && (p = __archive_read_ahead(a,min,(ssize_t *)0x0), p != (void *)0x0)) {
    archive_entry_copy_mac_metadata(entry,p,min);
    request = min + 0x1ff & 0xfffffffffffffe00;
    *(ulong *)h = request;
    if (request != 0) {
      __archive_read_consume(a,request);
      *(undefined8 *)h = 0;
    }
    wVar2 = tar_read_header(a,tar,entry,(size_t *)h);
    return wVar2;
  }
  *(undefined8 *)h = 0;
  return L'\xffffffe2';
}

Assistant:

static int
read_mac_metadata_blob(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int64_t size;
	size_t msize;
	const void *data;
	const char *p, *name;
	const wchar_t *wp, *wname;

	(void)h; /* UNUSED */

	wname = wp = archive_entry_pathname_w(entry);
	if (wp != NULL) {
		/* Find the last path element. */
		for (; *wp != L'\0'; ++wp) {
			if (wp[0] == '/' && wp[1] != L'\0')
				wname = wp + 1;
		}
		/*
		 * If last path element starts with "._", then
		 * this is a Mac extension.
		 */
		if (wname[0] != L'.' || wname[1] != L'_' || wname[2] == L'\0')
			return ARCHIVE_OK;
	} else {
		/* Find the last path element. */
		name = p = archive_entry_pathname(entry);
		if (p == NULL)
			return (ARCHIVE_FAILED);
		for (; *p != '\0'; ++p) {
			if (p[0] == '/' && p[1] != '\0')
				name = p + 1;
		}
		/*
		 * If last path element starts with "._", then
		 * this is a Mac extension.
		 */
		if (name[0] != '.' || name[1] != '_' || name[2] == '\0')
			return ARCHIVE_OK;
	}

 	/* Read the body as a Mac OS metadata blob. */
	size = archive_entry_size(entry);
	msize = (size_t)size;
	if (size < 0 || (uintmax_t)msize != (uintmax_t)size) {
		*unconsumed = 0;
		return (ARCHIVE_FATAL);
	}

	/*
	 * TODO: Look beyond the body here to peek at the next header.
	 * If it's a regular header (not an extension header)
	 * that has the wrong name, just return the current
	 * entry as-is, without consuming the body here.
	 * That would reduce the risk of us mis-identifying
	 * an ordinary file that just happened to have
	 * a name starting with "._".
	 *
	 * Q: Is the above idea really possible?  Even
	 * when there are GNU or pax extension entries?
	 */
	data = __archive_read_ahead(a, msize, NULL);
	if (data == NULL) {
		*unconsumed = 0;
		return (ARCHIVE_FATAL);
	}
	archive_entry_copy_mac_metadata(entry, data, msize);
	*unconsumed = (msize + 511) & ~ 511;
	tar_flush_unconsumed(a, unconsumed);
	return (tar_read_header(a, tar, entry, unconsumed));
}